

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.h
# Opt level: O2

motor * __thiscall ev3dev::motor::set_command(motor *this,string *v)

{
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"command",&local_39);
  device::set_attr_string(&this->super_device,&local_38,v);
  std::__cxx11::string::~string((string *)&local_38);
  return this;
}

Assistant:

motor& set_command(std::string v) {
            set_attr_string("command", v);
            return *this;
        }